

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O1

void GradientFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint8_t *preds;
  ulong uVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  int iVar7;
  byte *pbVar8;
  uint8_t *puVar9;
  long lVar10;
  
  *filtered_data = *data;
  if (1 < width) {
    uVar4 = 0;
    do {
      filtered_data[uVar4 + 1] = data[uVar4 + 1] - data[uVar4];
      uVar4 = uVar4 + 1;
    } while (width - 1 != uVar4);
  }
  if (1 < height) {
    lVar1 = (long)stride;
    pbVar5 = data + 1;
    puVar6 = filtered_data + lVar1 + 1;
    iVar7 = 1;
    do {
      filtered_data[lVar1] = data[lVar1] - *data;
      pbVar8 = pbVar5;
      puVar9 = puVar6;
      lVar10 = (ulong)(uint)width - 1;
      if (1 < width) {
        do {
          iVar3 = ((uint)*pbVar8 + (uint)pbVar8[lVar1 + -1]) - (uint)pbVar8[-1];
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          cVar2 = (char)iVar3;
          if (0xfe < iVar3) {
            cVar2 = -1;
          }
          *puVar9 = pbVar8[lVar1] - cVar2;
          lVar10 = lVar10 + -1;
          pbVar8 = pbVar8 + 1;
          puVar9 = puVar9 + 1;
        } while (lVar10 != 0);
      }
      data = data + lVar1;
      filtered_data = filtered_data + lVar1;
      iVar7 = iVar7 + 1;
      pbVar5 = pbVar5 + lVar1;
      puVar6 = puVar6 + lVar1;
    } while (iVar7 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoGradientFilter_C(const uint8_t* in,
                                           int width, int height, int stride,
                                           int row, int num_rows,
                                           int inverse, uint8_t* out) {
  const uint8_t* preds;
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;
  preds = inverse ? out : in;

  // left prediction for top scan-line
  if (row == 0) {
    out[0] = in[0];
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    row = 1;
    preds += stride;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    int w;
    // leftmost pixel: predict from above.
    PredictLine_C(in, preds - stride, out, 1, inverse);
    for (w = 1; w < width; ++w) {
      const int pred = GradientPredictor_C(preds[w - 1],
                                           preds[w - stride],
                                           preds[w - stride - 1]);
      out[w] = (uint8_t)(in[w] + (inverse ? pred : -pred));
    }
    ++row;
    preds += stride;
    in += stride;
    out += stride;
  }
}